

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamMultiMerger_p.h
# Opt level: O1

void __thiscall
BamTools::Internal::MultiMerger<BamTools::Algorithms::Sort::ByName>::Remove
          (MultiMerger<BamTools::Algorithms::Sort::ByName> *this,BamReader *reader)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  int iVar3;
  const_iterator __position;
  bool bVar4;
  string local_70;
  string local_50;
  
  if (reader != (BamReader *)0x0) {
    BamReader::GetFilename_abi_cxx11_(&local_50,reader);
    __position._M_node = (this->m_data)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->m_data)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)__position._M_node != p_Var1) {
      do {
        if (*(BamReader **)(__position._M_node + 1) == (BamReader *)0x0) {
          bVar2 = false;
        }
        else {
          BamReader::GetFilename_abi_cxx11_(&local_70,*(BamReader **)(__position._M_node + 1));
          if (local_70._M_string_length == local_50._M_string_length) {
            if (local_70._M_string_length == 0) {
              bVar4 = true;
            }
            else {
              iVar3 = bcmp(local_70._M_dataplus._M_p,local_50._M_dataplus._M_p,
                           local_70._M_string_length);
              bVar4 = iVar3 == 0;
            }
          }
          else {
            bVar4 = false;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p);
          }
          bVar2 = false;
          if (bVar4) {
            bVar2 = true;
            std::
            _Rb_tree<BamTools::Internal::MergeItem,BamTools::Internal::MergeItem,std::_Identity<BamTools::Internal::MergeItem>,BamTools::Internal::MergeItemSorter<BamTools::Algorithms::Sort::ByName>,std::allocator<BamTools::Internal::MergeItem>>
            ::erase_abi_cxx11_((_Rb_tree<BamTools::Internal::MergeItem,BamTools::Internal::MergeItem,std::_Identity<BamTools::Internal::MergeItem>,BamTools::Internal::MergeItemSorter<BamTools::Algorithms::Sort::ByName>,std::allocator<BamTools::Internal::MergeItem>>
                                *)&this->m_data,__position);
          }
        }
        if (bVar2) break;
        __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
      } while ((_Rb_tree_header *)__position._M_node != p_Var1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

inline void MultiMerger<Compare>::Remove(BamReader* reader) {

    if ( reader == 0 ) return;
    const std::string& filenameToRemove = reader->GetFilename();

    // iterate over readers in cache
    DataIterator dataIter = m_data.begin();
    DataIterator dataEnd  = m_data.end();
    for ( ; dataIter != dataEnd; ++dataIter ) {
        const MergeItem& item = (*dataIter);
        const BamReader* itemReader = item.Reader;
        if ( itemReader == 0 ) continue;

        // remove iterator on match
        if ( itemReader->GetFilename() == filenameToRemove ) {
            m_data.erase(dataIter);
            return;
        }
    }
}